

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttdriver.c
# Opt level: O1

FT_Error tt_glyph_load(FT_GlyphSlot ttslot,FT_Size ttsize,FT_UInt glyph_index,FT_Int32 load_flags)

{
  FT_Outline *outline;
  byte *pbVar1;
  int *piVar2;
  undefined8 *puVar3;
  short sVar4;
  ushort uVar5;
  TT_Face face_00;
  TT_Face pTVar6;
  void *pvVar7;
  FT_Memory pFVar8;
  long lVar9;
  FT_GlyphLoader loader;
  FT_CharMap pFVar10;
  FT_Vector *pFVar11;
  short *psVar12;
  FT_Fixed FVar13;
  FT_Fixed FVar14;
  undefined4 uVar15;
  short sVar16;
  FT_Pos FVar17;
  FT_UShort FVar18;
  FT_F2Dot14 FVar19;
  uint uVar20;
  int iVar21;
  uint uVar22;
  ulong uVar23;
  TT_ExecContext pTVar24;
  FT_Face pFVar25;
  FT_Generic_Finalizer p_Var26;
  FT_Pointer pvVar27;
  byte bVar28;
  bool bVar29;
  long lVar30;
  TT_GlyphZone zone;
  FT_CharMap pFVar31;
  TT_Face face;
  FT_UShort FVar32;
  long lVar33;
  TT_GraphicsState *pTVar34;
  FT_BBox *pFVar35;
  TT_GraphicsState *pTVar36;
  FT_Size_Internal *ppFVar37;
  FT_Pos *pFVar38;
  TT_ExecContext exec;
  FT_Driver pFVar39;
  bool bVar40;
  byte bVar41;
  FT_Short top_bearing;
  FT_UShort advance_height;
  FT_UShort advance_width;
  FT_Short left_bearing;
  uint local_208;
  FT_UShort local_202;
  ulong local_200;
  ushort local_1f2;
  TT_Face local_1f0;
  int local_1e4;
  undefined8 local_1e0;
  FT_Stream local_1d8;
  TT_ExecContext local_1d0;
  FT_Driver local_1c8;
  FT_Memory local_1c0;
  ushort local_1b2;
  TT_LoaderRec_ local_1b0;
  
  bVar41 = 0;
  if (ttslot == (FT_GlyphSlot)0x0) {
    return 0x25;
  }
  if (ttsize == (FT_Size)0x0) {
    return 0x24;
  }
  face_00 = (TT_Face)ttslot->face;
  if (face_00 == (TT_Face)0x0) {
    return 0x23;
  }
  if (((uint)(face_00->root).num_glyphs <= glyph_index) &&
     (((face_00->root).internal)->incremental_interface == (FT_Incremental_InterfaceRec *)0x0)) {
    return 6;
  }
  if ((load_flags & 2U) != 0) {
    uVar23 = (ulong)(load_flags & 0xfffffffd);
    if (((face_00->root).face_flags & 0x2000) == 0) {
      uVar23 = (ulong)(uint)load_flags;
    }
    load_flags = (uint)(uVar23 >> 0xe) & 2 | (uint)uVar23;
  }
  if ((load_flags & 0x401U) != 0) {
    load_flags = (uint)(((face_00->root).face_flags & 0x2000) == 0) * 2 | load_flags | 9;
  }
  pFVar25 = (FT_Face)&ttsize->metrics;
  if ((load_flags & 2U) == 0) {
    pFVar25 = (FT_Face)&ttsize[1].generic;
  }
  ttsize[1].face = pFVar25;
  lVar30 = ttsize[2].metrics.height;
  if ((((lVar30 != 0xffffffff) && (((long)load_flags & 8U) == 0)) &&
      (((face_00->root).face_index & 0x7fff0000) == 0)) &&
     (((face_00->root).face_flags & 0x8000) == 0)) {
    local_1f0 = (TT_Face)(ttsize->metrics).x_scale;
    local_200 = (ttsize->metrics).y_scale;
    uVar20 = (**(code **)((long)face_00->sfnt + 0x90))
                       (face_00,lVar30,glyph_index,load_flags,(face_00->root).stream,&ttslot->bitmap
                        ,&local_1b0);
    if (uVar20 == 0) {
      (ttslot->outline).n_contours = 0;
      (ttslot->outline).n_points = 0;
      (ttslot->metrics).width = ((ulong)local_1b0.face >> 0x10 & 0xffff) << 6;
      (ttslot->metrics).height = ((ulong)local_1b0.face & 0xffff) << 6;
      (ttslot->metrics).horiBearingX = (long)local_1b0.face._4_2_ << 6;
      (ttslot->metrics).horiBearingY = (long)local_1b0.face._6_2_ << 6;
      (ttslot->metrics).horiAdvance = ((ulong)local_1b0.size & 0xffff) << 6;
      (ttslot->metrics).vertBearingX = (long)local_1b0.size._2_2_ << 6;
      (ttslot->metrics).vertBearingY = (long)local_1b0.size._4_2_ << 6;
      (ttslot->metrics).vertAdvance = ((ulong)local_1b0.size >> 0x30) << 6;
      ttslot->format = FT_GLYPH_FORMAT_BITMAP;
      bVar40 = (load_flags & 0x10U) == 0;
      lVar30 = (long)local_1b0.size._2_2_;
      if (bVar40) {
        lVar30 = (long)local_1b0.face._4_2_;
      }
      sVar4 = local_1b0.size._4_2_;
      if (bVar40) {
        sVar4 = local_1b0.face._6_2_;
      }
      ttslot->bitmap_left = (FT_Int)lVar30;
      ttslot->bitmap_top = (int)sVar4;
    }
    pTVar6 = (TT_Face)ttslot->face;
    uVar23 = (pTVar6->root).face_flags;
    if ((char)uVar20 == -99) {
      if ((uVar23 & 1) == 0) {
        local_1b0.face = (TT_Face)((ulong)local_1b0.face & 0xffffffffffff0000);
        local_208 = local_208 & 0xffff0000;
        local_1f2 = 0;
        local_202 = 0;
        if (face_00->horz_metrics_size != 0) {
          (**(code **)((long)face_00->sfnt + 0x140))(face_00,0,glyph_index,&local_1b0,&local_1f2);
          TT_Get_VMetrics(face_00,glyph_index,0,(FT_Short *)&local_208,&local_202);
          (ttslot->outline).n_contours = 0;
          (ttslot->outline).n_points = 0;
          (ttslot->metrics).width = 0;
          (ttslot->metrics).height = 0;
          lVar30 = (long)(short)local_1b0.face * (long)(int)(uint)local_1f0;
          (ttslot->metrics).horiBearingX = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          (ttslot->metrics).horiBearingY = 0;
          lVar30 = (ulong)local_1f2 * (long)(int)(uint)local_1f0;
          (ttslot->metrics).horiAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          (ttslot->metrics).vertBearingX = 0;
          lVar30 = (long)(short)local_208 * (long)(int)local_200;
          (ttslot->metrics).vertBearingY = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          lVar30 = (ulong)local_202 * (long)(int)local_200;
          (ttslot->metrics).vertAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
          ttslot->format = FT_GLYPH_FORMAT_BITMAP;
          (ttslot->bitmap).pixel_mode = '\x01';
          ttslot->bitmap_left = 0;
          ttslot->bitmap_top = 0;
          uVar20 = 0;
        }
        bVar40 = false;
      }
      else {
LAB_00253826:
        bVar40 = true;
        uVar20 = load_flags;
      }
    }
    else if (uVar20 == 0) {
      if ((uVar23 & 0x20001) == 0) {
        bVar40 = false;
        uVar20 = 0;
      }
      else {
        local_1d8 = (pTVar6->root).stream;
        memset(&local_1b0,0,0x180);
        local_1b0.stream = local_1d8;
        local_1b0.composites.head = (FT_ListNode)0x0;
        local_1b0.composites.tail = (FT_ListNode)0x0;
        local_1b0.face = pTVar6;
        local_1b0.size = (TT_Size)ttsize;
        local_1b0.glyph = ttslot;
        local_1b0.load_flags = (long)load_flags;
        load_truetype_glyph(&local_1b0,glyph_index,0,'\x01');
        FT_List_Finalize(&local_1b0.composites,(FT_List_Destructor)0x0,
                         ((local_1b0.face)->root).memory,(void *)0x0);
        ttslot->linearHoriAdvance = (long)local_1b0.linear;
        ttslot->linearVertAdvance = (long)local_1b0.vadvance;
        if ((face_00->sbit_table_type == TT_SBIT_TABLE_TYPE_SBIX) && (0 < local_1b0.n_contours)) {
          bVar40 = (load_flags & 0x10U) != 0;
          pFVar35 = (FT_BBox *)&local_1b0.left_bearing;
          if (bVar40) {
            pFVar35 = &local_1b0.bbox;
          }
          pFVar38 = &local_1b0.bbox.yMin;
          if (bVar40) {
            pFVar38 = (FT_Pos *)&local_1b0.top_bearing;
          }
          FVar17 = *pFVar38;
          lVar30 = (long)(int)(uint)local_1f0 * (long)(int)pFVar35->xMin;
          ttslot->bitmap_left =
               ttslot->bitmap_left +
               ((int)((ulong)(lVar30 + 0x8000 + (lVar30 >> 0x3f)) >> 0x10) >> 6);
          lVar30 = (long)(int)local_200 * (long)(int)FVar17;
          ttslot->bitmap_top =
               ttslot->bitmap_top +
               ((int)((ulong)(lVar30 + 0x8000 + (lVar30 >> 0x3f)) >> 0x10) >> 6);
        }
        if (((ttslot->metrics).horiAdvance == 0) && (local_1b0.linear != 0)) {
          lVar30 = (long)(int)(uint)local_1f0 * (long)local_1b0.linear;
          (ttslot->metrics).horiAdvance =
               (long)(int)((ulong)((lVar30 >> 0x3f) + lVar30 + 0x8000) >> 0x10);
        }
        bVar40 = false;
        if ((ttslot->metrics).vertAdvance == 0) {
          uVar20 = 0;
          if (local_1b0.vadvance == 0) goto LAB_0025382c;
          lVar30 = (long)(int)local_200 * (long)local_1b0.vadvance;
          (ttslot->metrics).vertAdvance =
               (long)(int)((ulong)((lVar30 >> 0x3f) + lVar30 + 0x8000) >> 0x10);
        }
        bVar40 = false;
        uVar20 = 0;
      }
    }
    else {
      if ((uVar23 & 1) != 0) goto LAB_00253826;
      bVar40 = false;
    }
LAB_0025382c:
    local_1f0 = (TT_Face)CONCAT44(local_1f0._4_4_,uVar20);
    if (!bVar40) {
      return uVar20;
    }
  }
  if (((uint)load_flags >> 0xe & 1) != 0) {
    return 6;
  }
  local_200 = (ulong)(uint)load_flags;
  if (((load_flags & 1U) == 0) && ((char)ttsize[2].metrics.ascender == '\0')) {
    return 0x24;
  }
  if ((((uint)load_flags >> 0x14 & 1) != 0) && (face_00->svg != (void *)0x0)) {
    pvVar7 = face_00->sfnt;
    iVar21 = (**(code **)((long)pvVar7 + 0x168))(ttslot);
    if (iVar21 == 0) {
      FVar13 = (ttsize->metrics).x_scale;
      FVar14 = (ttsize->metrics).y_scale;
      ttslot->format = FT_GLYPH_FORMAT_SVG;
      local_1f0 = (TT_Face)((ulong)local_1f0 & 0xffffffff00000000);
      local_1e4 = iVar21;
      local_1d8 = (FT_Stream)pvVar7;
      (**(code **)((long)pvVar7 + 0x140))(face_00,0,glyph_index,&local_208,&local_202);
      (**(code **)((long)local_1d8 + 0x140))(face_00,1,glyph_index,&local_1f2);
      ttslot->linearHoriAdvance = (ulong)local_202;
      ttslot->linearVertAdvance = (ulong)local_1b2;
      lVar30 = (long)(int)FVar13 * (ulong)local_202;
      (ttslot->metrics).horiAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
      lVar30 = (long)(int)FVar14 * (ulong)local_1b2;
      (ttslot->metrics).vertAdvance = lVar30 + 0x8000 + (lVar30 >> 0x3f) >> 0x10;
      iVar21 = local_1e4;
    }
    if (iVar21 == 0) {
      return (uint)local_1f0;
    }
  }
  if (((uint)local_200 >> 0x17 & 1) != 0) {
    return 6;
  }
  local_1f0 = (TT_Face)ttslot->face;
  pFVar39 = (local_1f0->root).driver;
  local_1d8 = (local_1f0->root).stream;
  memset(&local_1b0,0,0x180);
  if ((local_200 & 2) == 0) {
    local_1e4 = CONCAT31(local_1e4._1_3_,(byte)local_200 >> 7);
    uVar20 = *(uint *)&ttsize[6].generic.finalizer;
    pTVar24 = (TT_ExecContext)(ulong)uVar20;
    if ((int)uVar20 < 0) {
      pFVar25 = ttsize->face;
      pFVar8 = pFVar25->memory;
      local_1c8 = pFVar39;
      ft_mem_free(pFVar8,ttsize[3].face);
      ttsize[3].face = (FT_Face)0x0;
      ft_mem_free(pFVar8,ttsize[3].generic.finalizer);
      ttsize[3].generic.finalizer = (FT_Generic_Finalizer)0x0;
      ft_mem_free(pFVar8,ttsize[5].generic.data);
      ttsize[5].generic.data = (void *)0x0;
      local_1c0 = pFVar8;
      ft_mem_free(pFVar8,*(void **)&ttsize[5].metrics);
      ttsize[5].metrics.x_ppem = 0;
      ttsize[5].metrics.y_ppem = 0;
      *(undefined4 *)&ttsize[5].metrics.field_0x4 = 0;
      pTVar24 = (TT_ExecContext)ttsize[6].generic.data;
      if (pTVar24 != (TT_ExecContext)0x0) {
        TT_Done_Context(pTVar24);
      }
      local_1d0 = (TT_ExecContext)&ttsize[5].metrics.x_scale;
      tt_glyphzone_done((TT_GlyphZone)local_1d0);
      ttsize[6].generic.finalizer = (FT_Generic_Finalizer)0xffffffffffffffff;
      pTVar24 = TT_New_Context((TT_Driver)pFVar25->driver);
      pFVar8 = local_1c0;
      ttsize[6].generic.data = pTVar24;
      uVar5 = *(ushort *)&pFVar25[1].extensions;
      *(uint *)((long)&ttsize[2].internal + 4) = (uint)uVar5;
      *(uint *)((long)&ttsize[3].generic.data + 4) =
           (uint)*(ushort *)((long)&pFVar25[1].extensions + 2);
      *(undefined4 *)&ttsize[2].internal = 0;
      *(undefined4 *)&ttsize[3].generic.data = 0;
      ttsize[3].metrics.x_ppem = 0;
      ttsize[3].metrics.y_ppem = 0;
      *(undefined4 *)&ttsize[3].metrics.field_0x4 = 0;
      ttsize[5].face = (FT_Face)pFVar25[4].glyph;
      *(undefined2 *)&ttsize[5].generic.finalizer =
           *(undefined2 *)((long)&pFVar25[1].autohint.finalizer + 6);
      *(undefined2 *)((long)&ttsize[2].metrics.ascender + 1) = 0;
      ttsize[2].metrics.x_scale = 0;
      ttsize[2].metrics.y_scale = 0;
      ttsize[2].generic.finalizer = (FT_Generic_Finalizer)0x0;
      ttsize[2].metrics.x_ppem = 0;
      ttsize[2].metrics.y_ppem = 0;
      *(undefined4 *)&ttsize[2].metrics.field_0x4 = 0;
      local_1e0 = pFVar25;
      pFVar25 = (FT_Face)ft_mem_realloc(local_1c0,0x28,0,(ulong)uVar5,(void *)0x0,
                                        (FT_Error *)&local_208);
      ttsize[3].face = pFVar25;
      if (local_208 == 0) {
        p_Var26 = (FT_Generic_Finalizer)
                  ft_mem_realloc(pFVar8,0x28,0,(ulong)*(uint *)((long)&ttsize[3].generic.data + 4),
                                 (void *)0x0,(FT_Error *)&local_208);
        ttsize[3].generic.finalizer = p_Var26;
        if (local_208 != 0) goto LAB_00253c31;
        pvVar27 = ft_mem_realloc(pFVar8,8,0,(FT_Long)ttsize[5].face,(void *)0x0,
                                 (FT_Error *)&local_208);
        ttsize[5].generic.data = pvVar27;
        if (local_208 != 0) goto LAB_00253c31;
        zone = (TT_GlyphZone)(ulong)*(ushort *)&ttsize[5].generic.finalizer;
        pvVar27 = ft_mem_realloc(pFVar8,8,0,(FT_Long)zone,(void *)0x0,(FT_Error *)&local_208);
        *(FT_Pointer *)&ttsize[5].metrics = pvVar27;
        if (local_208 != 0) goto LAB_00253c31;
        FVar32 = (short)*(undefined4 *)((long)&local_1e0[1].autohint.finalizer + 4) + 4;
        local_208 = tt_glyphzone_new(pFVar8,FVar32,(FT_Short)local_1d0,zone);
        if (local_208 != 0) goto LAB_00253c31;
        *(FT_UShort *)((long)&ttsize[5].metrics.y_scale + 4) = FVar32;
        pTVar34 = &tt_default_graphics_state;
        ppFVar37 = &ttsize[3].internal;
        for (lVar30 = 0xc; lVar30 != 0; lVar30 = lVar30 + -1) {
          *ppFVar37 = *(FT_Size_Internal *)pTVar34;
          pTVar34 = (TT_GraphicsState *)((long)pTVar34 + ((ulong)bVar41 * -2 + 1) * 8);
          ppFVar37 = ppFVar37 + (ulong)bVar41 * -2 + 1;
        }
        pFVar10 = (FT_CharMap)((local_1e0->driver->root).library)->debug_hooks[0];
        pFVar31 = (FT_CharMap)TT_RunIns;
        if (pFVar10 != (FT_CharMap)0x0) {
          pFVar31 = pFVar10;
        }
        local_1e0[4].charmap = pFVar31;
        local_208 = tt_size_run_fpgm((TT_Size)ttsize,(FT_Bool)local_1e4);
      }
      else {
LAB_00253c31:
        if (local_208 != 0) {
          tt_size_done_bytecode(ttsize);
        }
      }
      pTVar24 = (TT_ExecContext)(ulong)local_208;
      pFVar39 = local_1c8;
LAB_00253c53:
      if (((int)pTVar24 == 0) &&
         (uVar20 = *(uint *)((long)&ttsize[6].generic.finalizer + 4),
         pTVar24 = (TT_ExecContext)(ulong)uVar20, (int)uVar20 < 0)) {
        uVar5 = *(ushort *)((long)&ttsize[5].metrics.y_scale + 4);
        if (uVar5 != 0) {
          lVar30 = ttsize[5].metrics.ascender;
          lVar9 = ttsize[5].metrics.descender;
          lVar33 = 0;
          do {
            puVar3 = (undefined8 *)(lVar30 + lVar33);
            *puVar3 = 0;
            puVar3[1] = 0;
            puVar3 = (undefined8 *)(lVar9 + lVar33);
            *puVar3 = 0;
            puVar3[1] = 0;
            lVar33 = lVar33 + 0x10;
          } while ((ulong)uVar5 * 0x10 != lVar33);
        }
        uVar5 = *(ushort *)&ttsize[5].generic.finalizer;
        if (uVar5 != 0) {
          memset(*(void **)&ttsize[5].metrics,0,(ulong)uVar5 << 3);
        }
        pTVar34 = &tt_default_graphics_state;
        ppFVar37 = &ttsize[3].internal;
        for (lVar30 = 0xc; lVar30 != 0; lVar30 = lVar30 + -1) {
          *ppFVar37 = *(FT_Size_Internal *)pTVar34;
          pTVar34 = (TT_GraphicsState *)((long)pTVar34 + ((ulong)bVar41 * -2 + 1) * 8);
          ppFVar37 = ppFVar37 + (ulong)bVar41 * -2 + 1;
        }
        uVar20 = tt_size_run_prep((TT_Size)ttsize,(FT_Bool)local_1e4);
        pTVar24 = (TT_ExecContext)(ulong)uVar20;
      }
      uVar20 = (uint)pTVar24;
      if ((uint)pTVar24 == 0) {
LAB_00253cea:
        exec = (TT_ExecContext)ttsize[6].generic.data;
        if (exec != (TT_ExecContext)0x0) {
          iVar21 = *(int *)&pFVar39[2].root.library;
          if (iVar21 == 0x28) {
            bVar40 = (load_flags & 0xf0000U) != 0x20000;
            local_1e0 = (FT_Face)CONCAT44(local_1e0._4_4_,
                                          CONCAT31((int3)((load_flags & 0xf0000U) >> 8),
                                                   (load_flags & 0x70000U) == 0 && bVar40));
            bVar28 = (byte)((uint)load_flags >> 0x12) & 1;
          }
          else {
            bVar28 = 0;
            bVar40 = false;
            local_1e0 = (FT_Face)((ulong)local_1e0._4_4_ << 0x20);
          }
          exec->vertical_lcd_lean = bVar28;
          if (iVar21 == 0x28) {
            bVar29 = (load_flags & 0xf0000U) != 0x20000 && bVar40 == false;
          }
          else {
            bVar29 = (load_flags & 0xf0000U) != 0x20000;
          }
          local_1c0 = (FT_Memory)CONCAT71(local_1c0._1_7_,bVar29);
          local_1c8 = pFVar39;
          uVar22 = TT_Load_Context(exec,local_1f0,(TT_Size)ttsize);
          pFVar39 = local_1c8;
          if (uVar22 == 0) {
            if (*(int *)&local_1c8[2].root.library == 0x28) {
              bVar29 = bVar40 != (bool)exec->subpixel_hinting_lean;
              if (bVar29) {
                exec->subpixel_hinting_lean = bVar40;
              }
              if ((FT_Bool)local_1e0 != exec->grayscale_cleartype) {
                exec->grayscale_cleartype = (FT_Bool)local_1e0;
                bVar29 = true;
              }
            }
            else {
              bVar29 = false;
            }
            if (exec->grayscale != (FT_Bool)local_1c0) {
              exec->grayscale = (FT_Bool)local_1c0;
              bVar29 = true;
            }
            local_1d0 = exec;
            if (bVar29) {
              uVar22 = tt_size_run_prep((TT_Size)ttsize,(FT_Bool)local_1e4);
              exec = local_1d0;
              if (uVar22 != 0) goto LAB_002540d5;
              uVar20 = TT_Load_Context(local_1d0,local_1f0,(TT_Size)ttsize);
              pTVar24 = exec;
              if (uVar20 != 0) goto LAB_00253d3a;
            }
            uVar22 = (uint)pTVar24;
            uVar20 = *(uint *)&(exec->GS).instruct_control;
            if ((uVar20 & 2) != 0) {
              pTVar34 = &tt_default_graphics_state;
              pTVar36 = &exec->GS;
              for (lVar30 = 0xc; lVar30 != 0; lVar30 = lVar30 + -1) {
                FVar32 = pTVar34->rp1;
                FVar18 = pTVar34->rp2;
                FVar19 = (pTVar34->dualVector).x;
                pTVar36->rp0 = pTVar34->rp0;
                pTVar36->rp1 = FVar32;
                pTVar36->rp2 = FVar18;
                (pTVar36->dualVector).x = FVar19;
                pTVar34 = (TT_GraphicsState *)((long)pTVar34 + ((ulong)bVar41 * -2 + 1) * 8);
                pTVar36 = (TT_GraphicsState *)((long)pTVar36 + (ulong)bVar41 * -0x10 + 8);
              }
            }
            iVar21 = *(int *)&pFVar39[2].root.library;
            bVar29 = false;
            if ((bVar40 != false) && (bVar29 = false, iVar21 == 0x28)) {
              if ((ttslot->face->face_flags & 0x2000) == 0) {
                bVar29 = ((exec->GS).instruct_control & 4) == 0;
              }
              else {
                bVar29 = false;
              }
            }
            exec->backward_compatibility = bVar29;
            exec->pedantic_hinting = (byte)load_flags >> 7;
            local_1b0.instructions = exec->glyphIns;
            if (((local_1b0.load_flags & 0x200002) == 0) &&
               (((iVar21 != 0x28 || (exec->backward_compatibility == '\0')) &&
                ((local_1f0->postscript).isFixedPitch == 0)))) {
              local_1b0.widthp = (FT_Byte *)ttsize[2].metrics.descender;
            }
            else {
              local_1b0.widthp = (FT_Byte *)0x0;
            }
            load_flags = load_flags | uVar20 * 2 & 2;
            bVar40 = true;
            local_1b0.exec = exec;
          }
          else {
LAB_002540d5:
            bVar40 = false;
          }
          goto LAB_00253d3c;
        }
        uVar20 = 0x99;
      }
LAB_00253d3a:
      uVar22 = uVar20;
      bVar40 = false;
    }
    else {
      uVar22 = *(uint *)((long)&ttsize[6].generic.finalizer + 4);
      if ((int)uVar22 < 0) goto LAB_00253c53;
      if (uVar20 != 0) goto LAB_00253d3a;
      if (uVar22 == 0) goto LAB_00253cea;
      bVar40 = false;
    }
LAB_00253d3c:
    if (bVar40) goto LAB_00253d40;
  }
  else {
LAB_00253d40:
    loader = ttslot->internal->loader;
    FT_GlyphLoader_Rewind(loader);
    local_1b0.load_flags = (FT_ULong)load_flags;
    local_1b0.face = local_1f0;
    local_1b0.stream = local_1d8;
    local_1b0.composites.head = (FT_ListNode)0x0;
    local_1b0.composites.tail = (FT_ListNode)0x0;
    uVar22 = 0;
    local_1b0.size = (TT_Size)ttsize;
    local_1b0.glyph = ttslot;
    local_1b0.gloader = loader;
  }
  if (uVar22 != 0) {
    return uVar22;
  }
  if ((((uint)local_200 >> 8 & 1) != 0) &&
     (local_1b0.widthp != (FT_Byte *)0x0 && (local_200 & 0x10) == 0)) {
    (ttslot->metrics).horiAdvance = (ulong)local_1b0.widthp[glyph_index] << 6;
    uVar20 = 0;
    goto LAB_00254233;
  }
  ttslot->format = FT_GLYPH_FORMAT_OUTLINE;
  ttslot->num_subglyphs = 0;
  (ttslot->outline).flags = 0;
  uVar20 = load_truetype_glyph(&local_1b0,glyph_index,0,'\0');
  if (uVar20 == 0) {
    if (ttslot->format == FT_GLYPH_FORMAT_COMPOSITE) {
      ttslot->num_subglyphs = ((local_1b0.gloader)->base).num_subglyphs;
      ttslot->subglyphs = ((local_1b0.gloader)->base).subglyphs;
    }
    else {
      outline = &ttslot->outline;
      uVar15 = *(undefined4 *)&((local_1b0.gloader)->base).outline.field_0x24;
      (ttslot->outline).flags = ((local_1b0.gloader)->base).outline.flags;
      *(undefined4 *)&(ttslot->outline).field_0x24 = uVar15;
      sVar4 = ((local_1b0.gloader)->base).outline.n_contours;
      sVar16 = ((local_1b0.gloader)->base).outline.n_points;
      uVar15 = *(undefined4 *)&((local_1b0.gloader)->base).outline.field_0x4;
      pFVar11 = ((local_1b0.gloader)->base).outline.points;
      psVar12 = ((local_1b0.gloader)->base).outline.contours;
      (ttslot->outline).tags = ((local_1b0.gloader)->base).outline.tags;
      (ttslot->outline).contours = psVar12;
      outline->n_contours = sVar4;
      outline->n_points = sVar16;
      *(undefined4 *)&outline->field_0x4 = uVar15;
      (ttslot->outline).points = pFVar11;
      pbVar1 = (byte *)((long)&(ttslot->outline).flags + 1);
      *pbVar1 = *pbVar1 & 0xfd;
      if (local_1b0.pp1.x != 0) {
        FT_Outline_Translate(outline,-local_1b0.pp1.x,0);
      }
    }
    if ((local_200 & 2) == 0) {
      uVar20 = 8;
      if (((local_1b0.exec)->GS).scan_control != '\0') {
        switch(((local_1b0.exec)->GS).scan_type) {
        case 0:
          uVar20 = 0x20;
          break;
        case 1:
          goto switchD_00253eb5_caseD_1;
        case 4:
          uVar20 = 0x30;
          break;
        case 5:
          uVar20 = 0x10;
        }
      }
      piVar2 = &(ttslot->outline).flags;
      *piVar2 = *piVar2 | uVar20;
    }
switchD_00253eb5_caseD_1:
    uVar20 = compute_glyph_metrics(&local_1b0,glyph_index);
  }
  if (((local_200 & 1) == 0) && (*(ushort *)((long)&(ttsize[1].face)->num_faces + 2) < 0x18)) {
    pbVar1 = (byte *)((long)&(ttslot->outline).flags + 1);
    *pbVar1 = *pbVar1 | 1;
  }
LAB_00254233:
  FT_List_Finalize(&local_1b0.composites,(FT_List_Destructor)0x0,((local_1b0.face)->root).memory,
                   (void *)0x0);
  return uVar20;
}

Assistant:

static FT_Error
  tt_glyph_load( FT_GlyphSlot  ttslot,      /* TT_GlyphSlot */
                 FT_Size       ttsize,      /* TT_Size      */
                 FT_UInt       glyph_index,
                 FT_Int32      load_flags )
  {
    TT_GlyphSlot  slot = (TT_GlyphSlot)ttslot;
    TT_Size       size = (TT_Size)ttsize;
    FT_Face       face = ttslot->face;
    FT_Error      error;


    if ( !slot )
      return FT_THROW( Invalid_Slot_Handle );

    if ( !size )
      return FT_THROW( Invalid_Size_Handle );

    if ( !face )
      return FT_THROW( Invalid_Face_Handle );

#ifdef FT_CONFIG_OPTION_INCREMENTAL
    if ( glyph_index >= (FT_UInt)face->num_glyphs &&
         !face->internal->incremental_interface   )
#else
    if ( glyph_index >= (FT_UInt)face->num_glyphs )
#endif
      return FT_THROW( Invalid_Argument );

    if ( load_flags & FT_LOAD_NO_HINTING )
    {
      /* both FT_LOAD_NO_HINTING and FT_LOAD_NO_AUTOHINT   */
      /* are necessary to disable hinting for tricky fonts */

      if ( FT_IS_TRICKY( face ) )
        load_flags &= ~FT_LOAD_NO_HINTING;

      if ( load_flags & FT_LOAD_NO_AUTOHINT )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    if ( load_flags & ( FT_LOAD_NO_RECURSE | FT_LOAD_NO_SCALE ) )
    {
      load_flags |= FT_LOAD_NO_BITMAP | FT_LOAD_NO_SCALE;

      if ( !FT_IS_TRICKY( face ) )
        load_flags |= FT_LOAD_NO_HINTING;
    }

    /* use hinted metrics only if we load a glyph with hinting */
    size->metrics = ( load_flags & FT_LOAD_NO_HINTING )
                      ? &ttsize->metrics
                      : &size->hinted_metrics;

    /* now fill in the glyph slot with outline/bitmap/layered */
    error = TT_Load_Glyph( size, slot, glyph_index, load_flags );

    /* force drop-out mode to 2 - irrelevant now */
    /* slot->outline.dropout_mode = 2; */

    return error;
  }